

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O2

bool __thiscall QOpenGLShader::compileSourceFile(QOpenGLShader *this,QString *fileName)

{
  char cVar1;
  bool bVar2;
  QDebug *this_00;
  char *source;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_68;
  char *local_50;
  QDebug local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_38,fileName);
  cVar1 = QFile::open((QFile *)&local_38,1);
  if (cVar1 == '\0') {
    local_68.d._0_4_ = 2;
    local_68.size._4_4_ = 0;
    local_68.d._4_4_ = 0;
    local_68.ptr._0_4_ = 0;
    local_68.ptr._4_4_ = 0;
    local_68.size._0_4_ = 0;
    local_50 = "default";
    QMessageLogger::warning();
    this_00 = QDebug::operator<<(&local_40,"QOpenGLShader: Unable to open file");
    QDebug::operator<<(this_00,fileName);
    QDebug::~QDebug(&local_40);
    bVar2 = false;
  }
  else {
    local_68.size._0_4_ = 0xaaaaaaaa;
    local_68.size._4_4_ = 0xaaaaaaaa;
    local_68.d._0_4_ = 0xaaaaaaaa;
    local_68.d._4_4_ = 0xaaaaaaaa;
    local_68.ptr._0_4_ = 0xaaaaaaaa;
    local_68.ptr._4_4_ = 0xaaaaaaaa;
    QIODevice::readAll();
    source = (char *)CONCAT44(local_68.ptr._4_4_,local_68.ptr._0_4_);
    if (source == (char *)0x0) {
      source = (char *)&QByteArray::_empty;
    }
    bVar2 = compileSourceCode(this,source);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
  }
  QFile::~QFile((QFile *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLShader::compileSourceFile(const QString& fileName)
{
    QFile file(fileName);
    if (!file.open(QFile::ReadOnly)) {
        qWarning() << "QOpenGLShader: Unable to open file" << fileName;
        return false;
    }

    QByteArray contents = file.readAll();
    return compileSourceCode(contents.constData());
}